

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.cpp
# Opt level: O0

int main(void)

{
  undefined1 local_2c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraData;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  PlatformFolders local_1c8;
  PlatformFolders p;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  int local_c;
  
  local_c = 0;
  sago::getConfigHome_abi_cxx11_();
  run_test(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  sago::getDataHome_abi_cxx11_();
  run_test(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  sago::getCacheDir_abi_cxx11_();
  run_test(&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  sago::getDesktopFolder_abi_cxx11_();
  run_test(&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  sago::getDocumentsFolder_abi_cxx11_();
  run_test(&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  sago::getDownloadFolder_abi_cxx11_();
  run_test(&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  sago::getDownloadFolder1_abi_cxx11_();
  run_test(&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  sago::getPicturesFolder_abi_cxx11_();
  run_test(&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  sago::getPublicFolder_abi_cxx11_();
  run_test(&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  sago::getMusicFolder_abi_cxx11_();
  run_test(&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  sago::getVideoFolder_abi_cxx11_();
  run_test(&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  sago::getSaveGamesFolder1_abi_cxx11_();
  run_test(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  sago::getSaveGamesFolder2_abi_cxx11_();
  run_test((string *)&p);
  std::__cxx11::string::~string((string *)&p);
  sago::PlatformFolders::PlatformFolders(&local_1c8);
  sago::PlatformFolders::getDocumentsFolder_abi_cxx11_(&local_1e8,&local_1c8);
  run_test(&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  sago::PlatformFolders::getDesktopFolder_abi_cxx11_(&local_208,&local_1c8);
  run_test(&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  sago::PlatformFolders::getPicturesFolder_abi_cxx11_(&local_228,&local_1c8);
  run_test(&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  sago::PlatformFolders::getMusicFolder_abi_cxx11_(&local_248,&local_1c8);
  run_test(&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  sago::PlatformFolders::getVideoFolder_abi_cxx11_(&local_268,&local_1c8);
  run_test(&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  sago::PlatformFolders::getDownloadFolder1_abi_cxx11_(&local_288,&local_1c8);
  run_test(&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  sago::PlatformFolders::getSaveGamesFolder1_abi_cxx11_
            ((string *)
             &extraData.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1c8);
  run_test((string *)
           &extraData.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &extraData.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2c0);
  sago::appendAdditionalDataDirectories
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c0);
  run_test((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2c0);
  local_c = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2c0);
  sago::PlatformFolders::~PlatformFolders(&local_1c8);
  return local_c;
}

Assistant:

int main() {
	// Test plain functions
	run_test(sago::getConfigHome());
	run_test(sago::getDataHome());
	run_test(sago::getCacheDir());
	// Test non-member functions
	run_test(sago::getDesktopFolder());
	run_test(sago::getDocumentsFolder());
	run_test(sago::getDownloadFolder());
	run_test(sago::getDownloadFolder1());
	run_test(sago::getPicturesFolder());
	run_test(sago::getPublicFolder());
	run_test(sago::getMusicFolder());
	run_test(sago::getVideoFolder());
	run_test(sago::getSaveGamesFolder1());
	run_test(sago::getSaveGamesFolder2());
	// Test class methods
	sago::PlatformFolders p;
	run_test(p.getDocumentsFolder());
	run_test(p.getDesktopFolder());
	run_test(p.getPicturesFolder());
	run_test(p.getMusicFolder());
	run_test(p.getVideoFolder());
	run_test(p.getDownloadFolder1());
	run_test(p.getSaveGamesFolder1());
	// Test vector function
	std::vector<std::string> extraData;
	sago::appendAdditionalDataDirectories(extraData);
	run_test(extraData);
	return 0;
}